

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O1

void qt_punycodeEncoder(QStringView in,QString *output)

{
  storage_type_conflict *psVar1;
  storage_type_conflict sVar2;
  storage_type_conflict sVar3;
  Data *pDVar4;
  uint uVar5;
  uint uVar6;
  char16_t *pcVar7;
  storage_type_conflict *psVar8;
  storage_type_conflict *psVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  char *__file;
  uint uVar13;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  long lVar14;
  ulong uVar15;
  storage_type_conflict *psVar16;
  char16_t *pcVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  bool bVar24;
  QLatin1StringView str;
  uint local_7c;
  
  psVar16 = in.m_data;
  lVar19 = in.m_size;
  if (lVar19 < 0x7f) {
    iVar12 = (int)(output->d).size;
    __file = (char *)(long)iVar12;
    QString::resize(output,(qsizetype)(__file + lVar19));
    pDVar4 = (output->d).d;
    if ((pDVar4 == (Data *)0x0) ||
       (lVar14 = extraout_RDX,
       1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QString::reallocData(output,(output->d).size,KeepSize);
      lVar14 = extraout_RDX_00;
    }
    pcVar7 = (output->d).ptr;
    pcVar17 = pcVar7 + (long)__file;
    if (lVar19 == 0) {
      bVar24 = false;
    }
    else {
      lVar14 = lVar19 * 2;
      lVar20 = 0;
      bVar24 = false;
      do {
        if ((ushort)*(char16_t *)((long)psVar16 + lVar20) < 0x80) {
          *pcVar17 = *(char16_t *)((long)psVar16 + lVar20);
          pcVar17 = pcVar17 + 1;
        }
        else {
          bVar24 = true;
        }
        lVar20 = lVar20 + 2;
      } while (lVar14 != lVar20);
    }
    if (bVar24) {
      if (pcVar7 == (char16_t *)0x0) {
        pcVar7 = L"";
      }
      QString::truncate(output,(char *)((long)pcVar17 - (long)pcVar7 >> 1),lVar14);
      uVar5 = (int)(output->d).size - iVar12;
      if (uVar5 != 0) {
        QString::append(output,(QChar)0x2d);
      }
      psVar1 = psVar16 + lVar19;
      local_7c = 0;
      psVar9 = psVar16;
      do {
        psVar8 = psVar9;
        if (psVar1 <= psVar8) goto LAB_002659e5;
        psVar9 = psVar8 + 1;
        sVar2 = *psVar8;
        uVar15 = (ulong)(ushort)sVar2;
        if ((sVar2 & 0xf800U) == 0xd800) {
          bVar24 = true;
          if ((((sVar2 & 0xdc00U) == 0xd800) && (psVar9 < psVar1)) &&
             (sVar3 = *psVar9, ((ushort)sVar3 & 0xfc00) == 0xdc00)) {
            psVar9 = psVar8 + 2;
            uVar23 = (uint)(ushort)sVar2 * 0x400 + (uint)(ushort)sVar3;
            uVar15 = (ulong)uVar23;
            bVar24 = uVar23 == 0x35fdbff;
          }
        }
        else {
          bVar24 = false;
        }
        local_7c = local_7c + 1;
      } while (!bVar24);
      QString::truncate(output,__file,uVar15);
LAB_002659e5:
      if (psVar1 <= psVar8) {
        uVar11 = 0x80;
        uVar21 = 0x48;
        uVar22 = 0;
        uVar23 = uVar5;
        do {
          if (local_7c <= uVar23) {
            str.m_data = "xn--";
            str.m_size = 4;
            QString::insert(output,(qsizetype)__file,str);
            return;
          }
          if (lVar19 < 1) {
            uVar10 = 0xffffffff;
          }
          else {
            uVar10 = 0xffffffff;
            psVar9 = psVar16;
            do {
              sVar2 = *psVar9;
              uVar6 = (uint)(ushort)sVar2;
              if ((sVar2 & 0xfc00U) == 0xd800) {
                psVar8 = psVar9 + 1;
                psVar9 = psVar9 + 2;
                uVar6 = (uint)(ushort)sVar2 * 0x400 + (uint)(ushort)*psVar8 + 0xfca02400;
              }
              else {
                psVar9 = psVar9 + 1;
              }
              uVar13 = uVar10;
              if (uVar6 < uVar10) {
                uVar13 = uVar6;
              }
              if (uVar6 < uVar11) {
                uVar13 = uVar10;
              }
              uVar10 = uVar13;
            } while (psVar9 < psVar1);
          }
          lVar14 = (ulong)(uVar10 - uVar11) * (ulong)(uVar23 + 1);
          uVar13 = (uint)((ulong)lVar14 >> 0x20);
          uVar6 = (uint)lVar14;
          if ((uVar13 != 0) ||
             (bVar24 = CARRY4(uVar22,uVar6), uVar22 = uVar22 + uVar6, psVar9 = psVar16, bVar24)) {
            QString::truncate(output,__file,(ulong)uVar13);
            bVar24 = false;
          }
          else {
            do {
              psVar8 = psVar9;
              if (psVar1 <= psVar8) break;
              sVar2 = *psVar8;
              uVar11 = (uint)(ushort)sVar2;
              if ((sVar2 & 0xfc00U) == 0xd800) {
                psVar9 = psVar8 + 2;
                uVar11 = (uint)(ushort)sVar2 * 0x400 + (uint)(ushort)psVar8[1] + 0xfca02400;
              }
              else {
                psVar9 = psVar8 + 1;
              }
              if ((uVar11 < uVar10) && (uVar22 = uVar22 + 1, uVar22 == 0)) {
                QString::truncate(output,__file,(__off_t)psVar8);
                bVar24 = false;
                uVar22 = 0;
              }
              else {
                bVar24 = true;
                if (uVar11 == uVar10) {
                  uVar11 = -(uVar21 - 0x24);
                  if (uVar21 + 0x1a < 0x25) {
                    uVar11 = 0x1a;
                  }
                  if (0x23 < uVar21) {
                    uVar11 = 1;
                  }
                  uVar6 = uVar22;
                  if (uVar11 <= uVar22) {
                    uVar13 = 0x48;
                    uVar15 = (ulong)uVar22;
                    do {
                      uVar6 = (int)uVar15 - uVar11;
                      uVar15 = (ulong)uVar6 / (ulong)(0x24 - uVar11);
                      uVar6 = uVar6 % (0x24 - uVar11);
                      uVar18 = uVar6 + uVar11;
                      uVar11 = uVar6 + uVar11 + 0x4b;
                      if (0x19 < uVar18) {
                        uVar11 = uVar18;
                      }
                      uVar6 = (uint)uVar15;
                      QString::append(output,(QChar)((short)uVar11 + L'\x16'));
                      uVar11 = uVar13 - uVar21;
                      if (uVar21 + 0x1a <= uVar13) {
                        uVar11 = 0x1a;
                      }
                      if (uVar13 <= uVar21) {
                        uVar11 = 1;
                      }
                      uVar13 = uVar13 + 0x24;
                    } while (uVar11 <= uVar6);
                  }
                  uVar11 = uVar6 + 0x4b;
                  if (0x19 < uVar6) {
                    uVar11 = uVar6;
                  }
                  QString::append(output,(QChar)((short)uVar11 + L'\x16'));
                  uVar11 = 2;
                  if (uVar23 == uVar5) {
                    uVar11 = 700;
                  }
                  uVar23 = uVar23 + 1;
                  uVar22 = (int)(((ulong)uVar22 / (ulong)uVar11) / (ulong)uVar23) +
                           (int)((ulong)uVar22 / (ulong)uVar11);
                  if (uVar22 < 0x1c8) {
                    iVar12 = 0;
                  }
                  else {
                    iVar12 = 0;
                    uVar11 = uVar22;
                    do {
                      uVar22 = uVar11 / 0x23;
                      iVar12 = iVar12 + 0x24;
                      bVar24 = 0x3e57 < uVar11;
                      uVar11 = uVar22;
                    } while (bVar24);
                  }
                  uVar21 = (uVar22 * 0x24) / (uVar22 + 0x26) + iVar12;
                  bVar24 = true;
                  uVar22 = 0;
                }
              }
            } while (bVar24);
            bVar24 = psVar1 <= psVar8;
            uVar11 = uVar10;
            if (bVar24) {
              uVar22 = uVar22 + 1;
              uVar11 = uVar10 + 1;
            }
          }
        } while (bVar24);
      }
    }
  }
  return;
}

Assistant:

Q_AUTOTEST_EXPORT void qt_punycodeEncoder(QStringView in, QString *output)
{
    uint n = initial_n;
    uint delta = 0;
    uint bias = initial_bias;

    // Do not try to encode strings that certainly will result in output
    // that is longer than allowable domain name label length. Note that
    // non-BMP codepoints are encoded as two QChars.
    if (in.size() > MaxDomainLabelLength * 2)
        return;

    int outLen = output->size();
    output->resize(outLen + in.size());

    QChar *d = output->data() + outLen;
    bool skipped = false;
    // copy all basic code points verbatim to output.
    for (QChar c : in) {
        if (c.unicode() < 0x80)
            *d++ = c;
        else
            skipped = true;
    }

    // if there were only basic code points, just return them
    // directly; don't do any encoding.
    if (!skipped)
        return;

    output->truncate(d - output->constData());
    int copied = output->size() - outLen;

    // h and b now contain the number of basic code points in input.
    uint b = copied;
    uint h = copied;

    // if basic code points were copied, add the delimiter character.
    if (h > 0)
        *output += u'-';

    // compute the input length in Unicode code points.
    uint inputLength = 0;
    for (QStringIterator iter(in); iter.hasNext();) {
        inputLength++;

        if (iter.next(char32_t(-1)) == char32_t(-1)) {
            output->truncate(outLen);
            return; // invalid surrogate pair
        }
    }

    // while there are still unprocessed non-basic code points left in
    // the input string...
    while (h < inputLength) {
        // find the character in the input string with the lowest unprocessed value.
        uint m = std::numeric_limits<uint>::max();
        for (QStringIterator iter(in); iter.hasNext();) {
            auto c = iter.nextUnchecked();
            static_assert(std::numeric_limits<decltype(m)>::max()
                                  >= std::numeric_limits<decltype(c)>::max(),
                          "Punycode uint should be able to cover all codepoints");
            if (c >= n && c < m)
                m = c;
        }

        // delta = delta + (m - n) * (h + 1), fail on overflow
        uint tmp;
        if (qMulOverflow<uint>(m - n, h + 1, &tmp) || qAddOverflow<uint>(delta, tmp, &delta)) {
            output->truncate(outLen);
            return; // punycode_overflow
        }
        n = m;

        for (QStringIterator iter(in); iter.hasNext();) {
            auto c = iter.nextUnchecked();

            // increase delta until we reach the character processed in this iteration;
            // fail if delta overflows.
            if (c < n) {
                if (qAddOverflow<uint>(delta, 1, &delta)) {
                    output->truncate(outLen);
                    return; // punycode_overflow
                }
            }

            if (c == n) {
                appendEncode(output, delta, bias);

                bias = adapt(delta, h + 1, h == b);
                delta = 0;
                ++h;
            }
        }

        ++delta;
        ++n;
    }

    // prepend ACE prefix
    output->insert(outLen, "xn--"_L1);
    return;
}